

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc_manager_direct.cc
# Opt level: O2

void __thiscall webrtc::AgcManagerDirect::SetCaptureMuted(AgcManagerDirect *this,bool muted)

{
  if ((this->capture_muted_ != muted) && (this->capture_muted_ = muted, !muted)) {
    this->check_volume_on_next_process_ = true;
  }
  return;
}

Assistant:

void AgcManagerDirect::SetCaptureMuted(bool muted) {
  if (capture_muted_ == muted) {
    return;
  }
  capture_muted_ = muted;

  if (!muted) {
    // When we unmute, we should reset things to be safe.
    check_volume_on_next_process_ = true;
  }
}